

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::EndsWith::~EndsWith(EndsWith *this)

{
  EndsWith *in_RDI;
  
  ~EndsWith(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Matchers::Impl::StdString::EndsWith::~EndsWith() {}